

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

void Gia_ManConvertPackingToEdges(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  int *__s_00;
  int iVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint *puVar18;
  int nNodes [4];
  uint local_48 [4];
  long local_38;
  
  if (p->vPacking == (Vec_Int_t *)0x0) {
    return;
  }
  pVVar5 = p->vEdge1;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar5 = p->vEdge1;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_006bd371;
    }
    free(pVVar5);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_006bd371:
  pVVar5 = p->vEdge2;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar5 = p->vEdge2;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_006bd3b9;
    }
    free(pVVar5);
    p->vEdge2 = (Vec_Int_t *)0x0;
  }
LAB_006bd3b9:
  uVar1 = p->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar16 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar16 = uVar1;
  }
  pVVar5->nCap = uVar16;
  local_38 = (long)(int)uVar16;
  if (uVar16 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc(local_38 * 4);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = uVar1;
  __s_00 = (int *)0x0;
  memset(__s,0,(long)(int)uVar1 << 2);
  p->vEdge1 = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = uVar16;
  if (uVar16 != 0) {
    __s_00 = (int *)malloc(local_38 << 2);
  }
  pVVar5->pArray = __s_00;
  pVVar5->nSize = uVar1;
  memset(__s_00,0,(long)(int)uVar1 << 2);
  p->vEdge2 = pVVar5;
  pVVar5 = p->vPacking;
  iVar12 = pVVar5->nSize;
  if (0 < iVar12) {
    piVar3 = pVVar5->pArray;
    iVar2 = *piVar3;
    if (iVar12 == 1) {
      if (iVar2 == 0) {
        return;
      }
    }
    else {
      uVar10 = 1;
      iVar14 = 0;
      iVar11 = 0;
      do {
        uVar16 = piVar3[uVar10 & 0xffffffff];
        if (2 < uVar16 - 1) {
          __assert_fail("Entry > 0 && Entry < 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                        ,0x84,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
        }
        uVar9 = (int)uVar10 + 1;
        uVar10 = 0;
        do {
          if (iVar12 <= (int)(uVar9 + (int)uVar10)) goto LAB_006bd698;
          local_48[uVar10] = piVar3[uVar9 + uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar16 != uVar10);
        if ((ulong)uVar16 == 3) {
          lVar13 = (long)(int)local_48[0];
          if ((lVar13 < 0) || ((int)uVar1 <= (int)local_48[0])) goto LAB_006bd698;
          uVar15 = (ulong)local_48[2];
          piVar4 = __s;
          if ((__s[lVar13] == 0) || (iVar12 = 1, piVar4 = __s_00, __s_00[lVar13] == 0)) {
            piVar4[lVar13] = local_48[2];
            iVar12 = 0;
          }
          if (((int)local_48[2] < 0) || (uVar1 <= local_48[2])) goto LAB_006bd698;
          puVar18 = (uint *)(__s + uVar15);
          puVar7 = puVar18;
          if (*puVar18 == 0) {
LAB_006bd5d1:
            *puVar7 = local_48[0];
            iVar8 = 0;
          }
          else {
            iVar8 = 1;
            if (__s_00[uVar15] == 0) {
              puVar7 = (uint *)(__s_00 + uVar15);
              goto LAB_006bd5d1;
            }
          }
          lVar13 = (long)(int)local_48[1];
          if ((lVar13 < 0) || (uVar1 <= local_48[1])) goto LAB_006bd698;
          piVar4 = __s;
          if ((__s[lVar13] == 0) || (iVar6 = 1, piVar4 = __s_00, __s_00[lVar13] == 0)) {
            piVar4[lVar13] = local_48[2];
            iVar6 = 0;
          }
          if (*puVar18 == 0) {
LAB_006bd63a:
            *puVar18 = local_48[1];
            iVar17 = 0;
          }
          else {
            iVar17 = 1;
            if (__s_00[uVar15] == 0) {
              puVar18 = (uint *)(__s_00 + uVar15);
              goto LAB_006bd63a;
            }
          }
          iVar14 = iVar12 + iVar14 + iVar8 + iVar6 + iVar17;
        }
        else if (uVar16 == 2) {
          lVar13 = (long)(int)local_48[0];
          if ((lVar13 < 0) || ((int)uVar1 <= (int)local_48[0])) goto LAB_006bd698;
          uVar15 = (ulong)local_48[1];
          piVar4 = __s;
          if ((__s[lVar13] == 0) || (iVar12 = 1, piVar4 = __s_00, __s_00[lVar13] == 0)) {
            piVar4[lVar13] = local_48[1];
            iVar12 = 0;
          }
          if (((int)local_48[1] < 0) || (uVar1 <= local_48[1])) goto LAB_006bd698;
          piVar4 = __s;
          if ((__s[uVar15] == 0) || (iVar8 = 1, piVar4 = __s_00, __s_00[uVar15] == 0)) {
            piVar4[uVar15] = local_48[0];
            iVar8 = 0;
          }
          iVar14 = iVar12 + iVar14 + iVar8;
        }
        uVar10 = uVar9 + uVar10;
        iVar11 = iVar11 + 1;
        iVar12 = pVVar5->nSize;
      } while ((int)uVar10 < iVar12);
      if (iVar2 == iVar11) {
        if (iVar14 == 0) {
          return;
        }
        printf("Skipped %d illegal edges.\n");
        return;
      }
    }
    __assert_fail("nEntries == nEntries2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEdge.c"
                  ,0x98,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
  }
LAB_006bd698:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManConvertPackingToEdges( Gia_Man_t * p )
{
    int i, k, Entry, nEntries, nEntries2, nNodes[4], Count = 0;
    if ( p->vPacking == NULL )
        return;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // iterate through structures
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
            nNodes[k] = Vec_IntEntry(p->vPacking, i);
        i--;
        nEntries2++;
        // create edges
        if ( Entry == 2 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[1], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[0], p->vEdge1, p->vEdge2 );
        }
        else if ( Entry == 3 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[0], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[1], p->vEdge1, p->vEdge2 );
        }
    }
    assert( nEntries == nEntries2 );
    if ( Count )
        printf( "Skipped %d illegal edges.\n", Count );
}